

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnPredictForFile(XL *out,char *model_path,char *out_path)

{
  XLearn *this;
  HyperParam *pHVar1;
  Solver *pSVar2;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  float fVar3;
  runtime_error *_except_;
  XLearn *xl;
  Timer timer;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  Solver *in_stack_ffffffffffffff90;
  string local_68 [8];
  Solver *in_stack_ffffffffffffffa0;
  
  Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  Timer::tic((Timer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  this = (XLearn *)*in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,in_RSI,(allocator *)&stack0xffffffffffffff97);
  pHVar1 = XLearn::GetHyperParam(this);
  std::__cxx11::string::operator=((string *)&pHVar1->model_file,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,in_RDX,&local_91);
  pHVar1 = XLearn::GetHyperParam(this);
  std::__cxx11::string::operator=((string *)&pHVar1->output_file,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pHVar1 = XLearn::GetHyperParam(this);
  pHVar1->res_out = true;
  pHVar1 = XLearn::GetHyperParam(this);
  pHVar1->is_train = false;
  XLearn::GetSolver(this);
  XLearn::GetHyperParam(this);
  xLearn::Solver::Initialize
            ((Solver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (HyperParam *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  pSVar2 = XLearn::GetSolver(this);
  xLearn::Solver::SetPredict(pSVar2);
  pSVar2 = XLearn::GetSolver(this);
  xLearn::Solver::StartWork(in_stack_ffffffffffffffa0);
  XLearn::GetSolver(this);
  xLearn::Solver::Clear(in_stack_ffffffffffffff90);
  fVar3 = Timer::toc((Timer *)pSVar2);
  StringPrintf_abi_cxx11_((char *)(double)fVar3,local_b8,"Total time cost: %.2f (sec)");
  Color::print_info((string *)CONCAT44(fVar3,in_stack_fffffffffffffec0),
                    (bool)in_stack_fffffffffffffebf);
  std::__cxx11::string::~string(local_b8);
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForFile(XL *out, const char *model_path, 
                         const char *out_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().output_file = std::string(out_path);
  xl->GetHyperParam().res_out = true;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}